

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::GetObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index agentI,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *observations)

{
  Index *indices;
  Index IVar1;
  int iVar2;
  const_reference this_00;
  const_reference pvVar3;
  undefined4 extraout_var;
  PlanningUnitMADPDiscrete *this_01;
  
  this_00 = std::
            vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            ::at(&this->_m_firstOHIforT,(ulong)agentI);
  pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (this_00,(ulong)t);
  IVar1 = Globals::CastLIndexToIndex(*pvVar3);
  this_01 = (PlanningUnitMADPDiscrete *)this->_m_madp;
  indices = (observations->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar2 = (*(this_01->super_PlanningUnit)._vptr_PlanningUnit[0x18])(this_01,agentI);
  IVar1 = ComputeHistoryIndex(this_01,t,IVar1,indices,CONCAT44(extraout_var,iVar2));
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetObservationHistoryIndex(Index agentI, 
        Index t, const vector<Index>& observations) const
{
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(_m_firstOHIforT.at(agentI).at(t)), 
                &observations[0],
                GetNrObservations(agentI)
                )
          );

    //observations is a vector with the observation indices for stage 0...t-1
    //<o^0, o^1, ... , o^(t-1) >
    //from this we want to find the history observation index, which is given
    //by:
    //      o^0 * |O|^(t-1) + ... + o^(t-1) * |O|^0     + stage offset
    //
    //where |O| is the `base' of the number as specified by the tuple of 
    //indices
    //
    //
    //size_t this_OHI=_m_firstOHIforT.at(agentI).at(t);
    //size_t nrO = GetNrObservations(agentI);
    //for (Index ts=0; ts<t; ts++)
    //{
        //int exponent = t-1 - ts;
        //size_t b = (size_t) pow((double)nrO, (double)(exponent));
        //this_OHI += observations.at(ts) * b;
    //}
    //return(this_OHI);
}